

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

bool __thiscall RenX::Server::cancelVote(Server *this,TeamType team)

{
  int __fd;
  ssize_t sVar1;
  size_t in_RCX;
  char *__buf;
  int in_R8D;
  
  if (team == GDI) {
    __buf = "cancelvote 0";
  }
  else {
    if (team != Nod) {
      __buf = "cancelvote -1";
      __fd = 0xd;
      goto LAB_0013d6c1;
    }
    __buf = "cancelvote 1";
  }
  __fd = 0xc;
LAB_0013d6c1:
  sVar1 = send(this,__fd,__buf,in_RCX,in_R8D);
  return 0 < (int)sVar1;
}

Assistant:

bool RenX::Server::cancelVote(const RenX::TeamType team) {
	switch (team) {
	default:
		return send("cancelvote -1"sv) > 0;
	case TeamType::GDI:
		return send("cancelvote 0"sv) > 0;
	case TeamType::Nod:
		return send("cancelvote 1"sv) > 0;
	}
}